

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O1

Accel * __thiscall
embree::BVH8Factory::BVH8OBBVirtualCurve8v(BVH8Factory *this,Scene *scene,IntersectVariant ivariant)

{
  BVH8 *bvh;
  VirtualCurveIntersector *leafIntersector;
  Builder *pBVar1;
  Accel *pAVar2;
  Intersectors intersectors;
  Intersectors local_140;
  
  bvh = (BVH8 *)alignedMalloc(0x240,0x10);
  BVHN<8>::BVHN((BVHN<8> *)bvh,(PrimitiveType *)&CurveNv<8>::type,scene);
  leafIntersector = (*this->VirtualCurveIntersector8v)();
  BVH8OBBVirtualCurveIntersectors(&local_140,this,bvh,leafIntersector,ivariant);
  pBVar1 = (*this->BVH8Curve8vBuilder_OBB_New)(bvh,scene,0);
  pAVar2 = (Accel *)alignedMalloc(0x180,0x10);
  (pAVar2->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (pAVar2->super_AccelData).type = TY_ACCEL_INSTANCE;
  (pAVar2->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__RefCount_02207ae8;
  memcpy(&(pAVar2->super_AccelData).field_0x58,&local_140,0x118);
  (pAVar2->super_AccelData).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AccelInstance_02207a80;
  pAVar2[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)bvh;
  pAVar2[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pBVar1;
  return pAVar2;
}

Assistant:

Accel* BVH8Factory::BVH8OBBVirtualCurve8v(Scene* scene, IntersectVariant ivariant)
  {
    BVH8* accel = new BVH8(Curve8v::type,scene);
    Accel::Intersectors intersectors = BVH8OBBVirtualCurveIntersectors(accel,VirtualCurveIntersector8v(),ivariant);
    Builder* builder = BVH8Curve8vBuilder_OBB_New(accel,scene,0);
    return new AccelInstance(accel,builder,intersectors);
  }